

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_0::enumerateDeviceExtensions
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  TestLog *log;
  Context *this;
  TestStatus *pTVar2;
  qpTestResult qVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice pVVar5;
  ulong uVar6;
  pointer pVVar7;
  long lVar8;
  vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> properties;
  ScopedLogSection section_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionNames;
  ScopedLogSection section;
  ResultCollector results;
  allocator<char> local_2ba;
  allocator<char> local_2b9;
  string local_2b8;
  Context *local_298;
  ScopedLogSection local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  _Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> local_268;
  TestStatus *local_250;
  pointer local_248;
  string local_240;
  undefined1 local_220 [80];
  string local_1d0;
  MessageBuilder local_1b0;
  
  log = context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"",(allocator<char> *)&local_2b8);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_220,log,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"Global",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,"Global Extensions",(allocator<char> *)&local_290);
  local_250 = __return_storage_ptr__;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_268,log,(string *)&local_1b0,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_1b0);
  pIVar4 = Context::getInstanceInterface(context);
  pVVar5 = Context::getPhysicalDevice(context);
  ::vk::enumerateDeviceExtensionProperties
            ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
             &local_2b8,pIVar4,pVVar5,(char *)0x0);
  local_288._M_dataplus._M_p = (pointer)0x0;
  local_288._M_string_length = 0;
  local_288.field_2._M_allocated_capacity = 0;
  poVar1 = &local_1b0.m_str;
  lVar8 = 0;
  local_298 = context;
  for (uVar6 = 0;
      uVar6 < (ulong)((long)(local_2b8._M_string_length - (long)local_2b8._M_dataplus._M_p) / 0x104)
      ; uVar6 = uVar6 + 1) {
    local_1b0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<((ostream *)poVar1,": ");
    ::vk::operator<<((ostream *)poVar1,(VkExtensionProperties *)(local_2b8._M_dataplus._M_p + lVar8)
                    );
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,local_2b8._M_dataplus._M_p + lVar8,(allocator<char> *)&local_290
              );
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    lVar8 = lVar8 + 0x104;
  }
  checkDeviceExtensions
            ((ResultCollector *)local_220,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_288);
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult
            ((CheckEnumerateDeviceExtensionPropertiesIncompleteResult *)&local_1b0,&local_240);
  this = local_298;
  CheckIncompleteResult<vk::VkExtensionProperties>::operator()
            ((CheckIncompleteResult<vk::VkExtensionProperties> *)&local_1b0,local_298,
             (ResultCollector *)local_220,
             (long)(local_2b8._M_string_length - (long)local_2b8._M_dataplus._M_p) / 0x104);
  CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
  ~CheckEnumerateDeviceExtensionPropertiesIncompleteResult
            ((CheckEnumerateDeviceExtensionPropertiesIncompleteResult *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_240);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_288);
  std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
  ~_Vector_base((_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                 *)&local_2b8);
  tcu::ScopedLogSection::~ScopedLogSection((ScopedLogSection *)&local_268);
  pIVar4 = Context::getInstanceInterface(this);
  pVVar5 = Context::getPhysicalDevice(this);
  ::vk::enumerateDeviceLayerProperties
            ((vector<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_> *)&local_268,
             pIVar4,pVVar5);
  poVar1 = &local_1b0.m_str;
  for (pVVar7 = local_268._M_impl.super__Vector_impl_data._M_start;
      pVVar7 != local_268._M_impl.super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1b0,pVVar7->layerName,&local_2ba);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"Layer: ",&local_2b9);
    std::operator+(&local_2b8,&local_288,pVVar7->layerName);
    tcu::ScopedLogSection::ScopedLogSection(&local_290,log,(string *)&local_1b0,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_1b0);
    pIVar4 = Context::getInstanceInterface(local_298);
    pVVar5 = Context::getPhysicalDevice(local_298);
    ::vk::enumerateDeviceExtensionProperties
              ((vector<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_> *)
               &local_2b8,pIVar4,pVVar5,pVVar7->layerName);
    local_288.field_2._M_allocated_capacity = 0;
    local_288._M_dataplus._M_p = (pointer)0x0;
    local_288._M_string_length = 0;
    lVar8 = 0;
    local_248 = pVVar7;
    for (uVar6 = 0;
        uVar6 < (ulong)((long)(local_2b8._M_string_length - (long)local_2b8._M_dataplus._M_p) /
                       0x104); uVar6 = uVar6 + 1) {
      local_1b0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,": ");
      ::vk::operator<<((ostream *)poVar1,
                       (VkExtensionProperties *)(local_2b8._M_dataplus._M_p + lVar8));
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,local_2b8._M_dataplus._M_p + lVar8,&local_2ba);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      lVar8 = lVar8 + 0x104;
    }
    checkDeviceExtensions
              ((ResultCollector *)local_220,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_288);
    pVVar7 = local_248;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_248->layerName,&local_2ba);
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult
              ((CheckEnumerateDeviceExtensionPropertiesIncompleteResult *)&local_1b0,&local_1d0);
    CheckIncompleteResult<vk::VkExtensionProperties>::operator()
              ((CheckIncompleteResult<vk::VkExtensionProperties> *)&local_1b0,local_298,
               (ResultCollector *)local_220,
               (long)(local_2b8._M_string_length - (long)local_2b8._M_dataplus._M_p) / 0x104);
    CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
    ~CheckEnumerateDeviceExtensionPropertiesIncompleteResult
              ((CheckEnumerateDeviceExtensionPropertiesIncompleteResult *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_288);
    std::_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>::
    ~_Vector_base((_Vector_base<vk::VkExtensionProperties,_std::allocator<vk::VkExtensionProperties>_>
                   *)&local_2b8);
    tcu::ScopedLogSection::~ScopedLogSection(&local_290);
  }
  std::_Vector_base<vk::VkLayerProperties,_std::allocator<vk::VkLayerProperties>_>::~_Vector_base
            (&local_268);
  qVar3 = tcu::ResultCollector::getResult((ResultCollector *)local_220);
  std::__cxx11::string::string((string *)&local_1b0,(string *)(local_220 + 0x30));
  pTVar2 = local_250;
  local_250->m_code = qVar3;
  std::__cxx11::string::string((string *)&local_250->m_description,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_220);
  return pTVar2;
}

Assistant:

tcu::TestStatus enumerateDeviceExtensions (Context& context)
{
	TestLog&				log		= context.getTestContext().getLog();
	tcu::ResultCollector	results	(log);

	{
		const ScopedLogSection				section		(log, "Global", "Global Extensions");
		const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), DE_NULL);
		vector<string>						extensionNames;

		for (size_t ndx = 0; ndx < properties.size(); ndx++)
		{
			log << TestLog::Message << ndx << ": " << properties[ndx] << TestLog::EndMessage;

			extensionNames.push_back(properties[ndx].extensionName);
		}

		checkDeviceExtensions(results, extensionNames);
		CheckEnumerateDeviceExtensionPropertiesIncompleteResult()(context, results, properties.size());
	}

	{
		const vector<VkLayerProperties>	layers	= enumerateDeviceLayerProperties(context.getInstanceInterface(), context.getPhysicalDevice());

		for (vector<VkLayerProperties>::const_iterator layer = layers.begin(); layer != layers.end(); ++layer)
		{
			const ScopedLogSection				section		(log, layer->layerName, string("Layer: ") + layer->layerName);
			const vector<VkExtensionProperties>	properties	= enumerateDeviceExtensionProperties(context.getInstanceInterface(), context.getPhysicalDevice(), layer->layerName);
			vector<string>						extensionNames;

			for (size_t extNdx = 0; extNdx < properties.size(); extNdx++)
			{
				log << TestLog::Message << extNdx << ": " << properties[extNdx] << TestLog::EndMessage;


				extensionNames.push_back(properties[extNdx].extensionName);
			}

			checkDeviceExtensions(results, extensionNames);
			CheckEnumerateDeviceExtensionPropertiesIncompleteResult(layer->layerName)(context, results, properties.size());
		}
	}

	return tcu::TestStatus(results.getResult(), results.getMessage());
}